

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

void EncodeWindowBits(int lgwin,int large_window,uint16_t *last_bytes,uint8_t *last_bytes_bits)

{
  uint8_t *last_bytes_bits_local;
  uint16_t *last_bytes_local;
  int large_window_local;
  int lgwin_local;
  
  if (large_window == 0) {
    if (lgwin == 0x10) {
      *last_bytes = 0;
      *last_bytes_bits = '\x01';
    }
    else if (lgwin == 0x11) {
      *last_bytes = 1;
      *last_bytes_bits = '\a';
    }
    else if (lgwin < 0x12) {
      *last_bytes = ((short)lgwin + -8) * 0x10 | 1;
      *last_bytes_bits = '\a';
    }
    else {
      *last_bytes = ((short)lgwin + -0x11) * 2 | 1;
      *last_bytes_bits = '\x04';
    }
  }
  else {
    *last_bytes = (ushort)((lgwin & 0x3fU) << 8) | 0x11;
    *last_bytes_bits = '\x0e';
  }
  return;
}

Assistant:

static void EncodeWindowBits(int lgwin, BROTLI_BOOL large_window,
    uint16_t* last_bytes, uint8_t* last_bytes_bits) {
  if (large_window) {
    *last_bytes = (uint16_t)(((lgwin & 0x3F) << 8) | 0x11);
    *last_bytes_bits = 14;
  } else {
    if (lgwin == 16) {
      *last_bytes = 0;
      *last_bytes_bits = 1;
    } else if (lgwin == 17) {
      *last_bytes = 1;
      *last_bytes_bits = 7;
    } else if (lgwin > 17) {
      *last_bytes = (uint16_t)(((lgwin - 17) << 1) | 0x01);
      *last_bytes_bits = 4;
    } else {
      *last_bytes = (uint16_t)(((lgwin - 8) << 4) | 0x01);
      *last_bytes_bits = 7;
    }
  }
}